

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<capnp::IncomingRpcMessage> * __thiscall
kj::Own<capnp::IncomingRpcMessage>::operator=
          (Own<capnp::IncomingRpcMessage> *this,Own<capnp::IncomingRpcMessage> *other)

{
  Disposer *this_00;
  IncomingRpcMessage *object;
  IncomingRpcMessage *ptrCopy;
  Disposer *disposerCopy;
  Own<capnp::IncomingRpcMessage> *other_local;
  Own<capnp::IncomingRpcMessage> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (IncomingRpcMessage *)0x0;
  if (object != (IncomingRpcMessage *)0x0) {
    Disposer::dispose<capnp::IncomingRpcMessage>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }